

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O0

void Dch_ClassesCheck(Dch_Cla_t *p)

{
  Aig_Obj_t **ppAVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int local_3c;
  int local_38;
  int nCands1;
  int nClasses;
  int nLits;
  int k;
  int i;
  Aig_Obj_t **ppClass;
  Aig_Obj_t *pPrev;
  Aig_Obj_t *pObj;
  Dch_Cla_t *p_local;
  
  nCands1 = 0;
  local_38 = 0;
  for (nClasses = 0; iVar2 = Aig_ManObjNumMax(p->pAig), nClasses < iVar2; nClasses = nClasses + 1) {
    ppAVar1 = p->pId2Class[nClasses];
    if (ppAVar1 != (Aig_Obj_t **)0x0) {
      ppClass = (Aig_Obj_t **)0x0;
      for (nLits = 0; nLits < p->pClassSizes[(*ppAVar1)->Id]; nLits = nLits + 1) {
        pAVar4 = p->pId2Class[(*ppAVar1)->Id][nLits];
        if (pAVar4 != (Aig_Obj_t *)0x0) {
          if (nLits == 0) {
            pAVar3 = Aig_ObjRepr(p->pAig,pAVar4);
            ppClass = (Aig_Obj_t **)pAVar4;
            if (pAVar3 != (Aig_Obj_t *)0x0) {
              __assert_fail("Aig_ObjRepr(p->pAig, pObj) == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                            ,0xfc,"void Dch_ClassesCheck(Dch_Cla_t *)");
            }
          }
          else {
            pAVar3 = Aig_ObjRepr(p->pAig,pAVar4);
            if (pAVar3 != *ppAVar1) {
              __assert_fail("Aig_ObjRepr(p->pAig, pObj) == ppClass[0]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                            ,0xff,"void Dch_ClassesCheck(Dch_Cla_t *)");
            }
            if (pAVar4->Id <= *(int *)((long)ppClass + 0x24)) {
              __assert_fail("pPrev->Id < pObj->Id",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                            ,0x100,"void Dch_ClassesCheck(Dch_Cla_t *)");
            }
            nCands1 = nCands1 + 1;
            ppClass = (Aig_Obj_t **)pAVar4;
          }
        }
      }
      local_38 = local_38 + 1;
    }
  }
  local_3c = 0;
  for (nLits = 0; iVar2 = Vec_PtrSize(p->pAig->vObjs), nLits < iVar2; nLits = nLits + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,nLits);
    if (pAVar4 != (Aig_Obj_t *)0x0) {
      iVar2 = Dch_ObjIsConst1Cand(p->pAig,pAVar4);
      local_3c = iVar2 + local_3c;
    }
  }
  if (p->nLits != nCands1) {
    __assert_fail("p->nLits == nLits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                  ,0x10a,"void Dch_ClassesCheck(Dch_Cla_t *)");
  }
  if (p->nCands1 != local_3c) {
    __assert_fail("p->nCands1 == nCands1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                  ,0x10b,"void Dch_ClassesCheck(Dch_Cla_t *)");
  }
  if (p->nClasses == local_38) {
    return;
  }
  __assert_fail("p->nClasses == nClasses",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                ,0x10c,"void Dch_ClassesCheck(Dch_Cla_t *)");
}

Assistant:

void Dch_ClassesCheck( Dch_Cla_t * p )
{
    Aig_Obj_t * pObj, * pPrev, ** ppClass;
    int i, k, nLits, nClasses, nCands1;
    nClasses = nLits = 0;
    Dch_ManForEachClass( p, ppClass, k )
    {
        pPrev = NULL;
        Dch_ClassForEachNode( p, ppClass[0], pObj, i )
        {
            if ( i == 0 )
                assert( Aig_ObjRepr(p->pAig, pObj) == NULL );
            else
            {
                assert( Aig_ObjRepr(p->pAig, pObj) == ppClass[0] );
                assert( pPrev->Id < pObj->Id );
                nLits++;
            }
            pPrev = pObj;
        }
        nClasses++;
    }
    nCands1 = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
        nCands1 += Dch_ObjIsConst1Cand( p->pAig, pObj );
    assert( p->nLits == nLits );
    assert( p->nCands1 == nCands1 );
    assert( p->nClasses == nClasses );
}